

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

string_view __thiscall wasm::WasmBinaryReader::getByteView(WasmBinaryReader *this,size_t size)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  string_view sVar4;
  string local_40;
  
  pcVar1 = (this->input->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->input->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar1;
  if ((size <= uVar3) && (uVar2 = this->pos, uVar2 <= uVar3 - size)) {
    this->pos = uVar2 + size;
    sVar4._M_str = pcVar1 + uVar2;
    sVar4._M_len = size;
    return sVar4;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"unexpected end of input","");
  throwError(this,&local_40);
}

Assistant:

std::string_view WasmBinaryReader::getByteView(size_t size) {
  if (size > input.size() || pos > input.size() - size) {
    throwError("unexpected end of input");
  }
  pos += size;
  return {input.data() + (pos - size), size};
}